

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O2

TPM_RC TPM2_EncryptDecrypt(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT keyHandle,
                          TPMI_YES_NO decrypt,TPM_ALG_ID cipherMode,TPM2B_IV *ivIn,
                          TPM2B_MAX_BUFFER *inData,TPM2B_MAX_BUFFER *outData,TPM2B_IV *ivOut)

{
  UINT16 UVar1;
  ushort uVar2;
  TPM_RC TVar3;
  TPM_RC TVar4;
  INT32 sizeParamBuf;
  TPMI_YES_NO decrypt_local;
  BYTE *paramBuf;
  TPMI_DH_OBJECT keyHandle_local;
  TPM_ALG_ID cipherMode_local;
  TSS_SESSION *session_local;
  TPM2B_IV local_3062;
  TSS_CMD_CONTEXT CmdCtx;
  
  sizeParamBuf = 0x1000;
  paramBuf = CmdCtx.ParamBuffer;
  CmdCtx.ParamSize = 0;
  decrypt_local = decrypt;
  keyHandle_local = keyHandle;
  cipherMode_local = cipherMode;
  session_local = session;
  UVar1 = UINT8_Marshal(&decrypt_local,&paramBuf,&sizeParamBuf);
  CmdCtx.ParamSize = CmdCtx.ParamSize + UVar1;
  UVar1 = UINT16_Marshal(&cipherMode_local,&paramBuf,&sizeParamBuf);
  CmdCtx.ParamSize = CmdCtx.ParamSize + UVar1;
  if (ivIn == (TPM2B_IV *)0x0) {
    uVar2 = UINT16_Marshal(&NullSize,&paramBuf,&sizeParamBuf);
  }
  else {
    uVar2 = TPM2B_IV_Marshal(ivIn,&paramBuf,&sizeParamBuf);
  }
  CmdCtx.ParamSize = uVar2 + CmdCtx.ParamSize;
  UVar1 = TPM2B_MAX_BUFFER_Marshal(inData,&paramBuf,&sizeParamBuf);
  CmdCtx.ParamSize = CmdCtx.ParamSize + UVar1;
  TVar3 = TSS_DispatchCmd(tpm,0x164,&keyHandle_local,1,&session_local,1,&CmdCtx);
  if (TVar3 == 0) {
    TVar4 = TPM2B_MAX_BUFFER_Unmarshal(outData,&CmdCtx.RespBufPtr,(INT32 *)&CmdCtx.RespBytesLeft);
    TVar3 = 0x9a;
    if (TVar4 == 0) {
      if (ivOut == (TPM2B_IV *)0x0) {
        ivOut = &local_3062;
      }
      TVar4 = TPM2B_IV_Unmarshal(ivOut,&CmdCtx.RespBufPtr,(INT32 *)&CmdCtx.RespBytesLeft);
      if (TVar4 == 0) {
        TVar3 = 0;
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPM2_EncryptDecrypt(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          keyHandle,          // IN
    TPMI_YES_NO             decrypt,            // IN
    TPM_ALG_ID              cipherMode,         // IN
    TPM2B_IV               *ivIn,               // IN [opt]
    TPM2B_MAX_BUFFER       *inData,             // IN
    TPM2B_MAX_BUFFER       *outData,            // OUT
    TPM2B_IV               *ivOut               // OUT [opt]
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL(TPMI_YES_NO, &decrypt);
    TSS_MARSHAL(TPM_ALG_ID, &cipherMode);
    TSS_MARSHAL_OPT2B(TPM2B_IV, ivIn);
    TSS_MARSHAL(TPM2B_MAX_BUFFER, inData);
    DISPATCH_CMD(EncryptDecrypt, &keyHandle, 1, &session, 1);
    TSS_UNMARSHAL(TPM2B_MAX_BUFFER, outData);
    TSS_UNMARSHAL_OPT(TPM2B_IV, ivOut);
    END_CMD();
}